

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckIndent.cxx
# Opt level: O2

bool __thiscall kws::Parser::CheckValidSwitchStatement(Parser *this,uint posSwitch)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  
  pcVar2 = (this->m_BufferNoComment)._M_dataplus._M_p;
  cVar1 = pcVar2[posSwitch - 1];
  if ((cVar1 != '\n') && (posSwitch - 1 != 0 && cVar1 != ' ')) {
    return false;
  }
  bVar3 = true;
  if ((ulong)(posSwitch + 6) < (this->m_BufferNoComment)._M_string_length) {
    bVar3 = (pcVar2[posSwitch + 6] & 0xf7U) == 0x20;
  }
  return bVar3;
}

Assistant:

bool Parser::CheckValidSwitchStatement(unsigned int posSwitch)
{
  if((m_BufferNoComment[posSwitch-1]!='\n'
     && m_BufferNoComment[posSwitch-1]!=' '
     && posSwitch-1 != 0) ||
     (m_BufferNoComment.size() > posSwitch+6
      && m_BufferNoComment[posSwitch+6] != ' '
      && m_BufferNoComment[posSwitch+6] != '('))
   {
   return false;
   }
  return true;
}